

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha-1.c
# Opt level: O2

void sha1_result(sha1_ctxt *ctxt,void *digest0)

{
  sha1_pad(ctxt);
  *(uchar *)digest0 = (ctxt->h).b8[3];
  *(uchar *)((long)digest0 + 1) = (ctxt->h).b8[2];
  *(uchar *)((long)digest0 + 2) = (ctxt->h).b8[1];
  *(uchar *)((long)digest0 + 3) = (ctxt->h).b8[0];
  *(uchar *)((long)digest0 + 4) = (ctxt->h).b8[7];
  *(uchar *)((long)digest0 + 5) = (ctxt->h).b8[6];
  *(uchar *)((long)digest0 + 6) = (ctxt->h).b8[5];
  *(uchar *)((long)digest0 + 7) = (ctxt->h).b8[4];
  *(uchar *)((long)digest0 + 8) = (ctxt->h).b8[0xb];
  *(uchar *)((long)digest0 + 9) = (ctxt->h).b8[10];
  *(uchar *)((long)digest0 + 10) = (ctxt->h).b8[9];
  *(uchar *)((long)digest0 + 0xb) = (ctxt->h).b8[8];
  *(uchar *)((long)digest0 + 0xc) = (ctxt->h).b8[0xf];
  *(uchar *)((long)digest0 + 0xd) = (ctxt->h).b8[0xe];
  *(uchar *)((long)digest0 + 0xe) = (ctxt->h).b8[0xd];
  *(uchar *)((long)digest0 + 0xf) = (ctxt->h).b8[0xc];
  *(uchar *)((long)digest0 + 0x10) = (ctxt->h).b8[0x13];
  *(uchar *)((long)digest0 + 0x11) = (ctxt->h).b8[0x12];
  *(uchar *)((long)digest0 + 0x12) = (ctxt->h).b8[0x11];
  *(uchar *)((long)digest0 + 0x13) = (ctxt->h).b8[0x10];
  return;
}

Assistant:

void
sha1_result(struct sha1_ctxt *ctxt, void *digest0)
{
	unsigned char *digest;

	digest = (unsigned char *)digest0;
	sha1_pad(ctxt);
#if BYTE_ORDER == BIG_ENDIAN
	memcpy(digest, &ctxt->h.b8[0], 20);
#else
	digest[0] = ctxt->h.b8[3]; digest[1] = ctxt->h.b8[2];
	digest[2] = ctxt->h.b8[1]; digest[3] = ctxt->h.b8[0];
	digest[4] = ctxt->h.b8[7]; digest[5] = ctxt->h.b8[6];
	digest[6] = ctxt->h.b8[5]; digest[7] = ctxt->h.b8[4];
	digest[8] = ctxt->h.b8[11]; digest[9] = ctxt->h.b8[10];
	digest[10] = ctxt->h.b8[9]; digest[11] = ctxt->h.b8[8];
	digest[12] = ctxt->h.b8[15]; digest[13] = ctxt->h.b8[14];
	digest[14] = ctxt->h.b8[13]; digest[15] = ctxt->h.b8[12];
	digest[16] = ctxt->h.b8[19]; digest[17] = ctxt->h.b8[18];
	digest[18] = ctxt->h.b8[17]; digest[19] = ctxt->h.b8[16];
#endif
}